

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

int Tas_ManPropagate(Tas_Man_t *p,int Level)

{
  Tas_Cls_t *pClause;
  Gia_Obj_t *pGVar1;
  int *piVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Gia_Obj_t **ppGVar8;
  uint uVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  Gia_Obj_t *pGVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  int *piVar22;
  long lVar23;
  
  do {
    iVar16 = (p->pProp).iHead;
    lVar20 = (long)iVar16;
    uVar6 = (p->pProp).iTail;
    uVar21 = (ulong)uVar6;
    if (iVar16 < (int)uVar6) {
LAB_00719f07:
      uVar6 = (uint)uVar21;
      pGVar1 = (p->pProp).pData[lVar20];
      if (pGVar1 != (Gia_Obj_t *)0x0) {
        if (((ulong)pGVar1 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x479,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        if (((uint)*(undefined8 *)pGVar1 >> 0x1e & 1) == 0) {
          __assert_fail("Tas_VarIsAssigned(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x47a,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
        }
        s_Counter3 = s_Counter3 + 1;
        pGVar11 = p->pAig->pObjs;
        if ((pGVar1 < pGVar11) || (pGVar11 + p->pAig->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar16 = (int)((ulong)((long)pGVar1 - (long)pGVar11) >> 2);
        if (iVar16 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar6 = ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x3e) & 1) + iVar16 * 0x55555556;
        iVar16 = p->pWatches[uVar6 ^ 1];
        iVar7 = 0;
        if (iVar16 != 0) {
          piVar22 = p->pWatches + (uVar6 ^ 1);
LAB_00719fa5:
          piVar2 = (p->pStore).pData;
          lVar19 = (long)iVar16;
          pClause = (Tas_Cls_t *)(piVar2 + lVar19);
          if (pClause[1].iNext[0] == uVar6) {
            pClause[1].iNext[0] = pClause[1].iNext[1];
            pClause[1].iNext[1] = uVar6;
            *(ulong *)pClause->iNext =
                 *(long *)pClause->iNext << 0x20 | *(ulong *)pClause->iNext >> 0x20;
          }
          if (pClause[1].iNext[1] != uVar6) {
            __assert_fail("pCur->pLits[1] == LitF",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x42e,"int Tas_ManPropagateWatch(Tas_Man_t *, int, int)");
          }
          uVar5 = pClause[1].iNext[0];
          if ((int)uVar5 < 0) goto LAB_0071a7ec;
          iVar16 = p->pAig->nObjs;
          if (iVar16 <= (int)(uVar5 >> 1)) goto LAB_0071a80b;
          pGVar11 = p->pAig->pObjs;
          uVar3 = *(undefined8 *)(pGVar11 + (uVar5 >> 1));
          if ((((uint)uVar3 >> 0x1e & 1) != 0) &&
             ((((uint)((ulong)uVar3 >> 0x3e) ^ uVar5) & 1) != 0)) {
LAB_0071a0f3:
            piVar22 = pClause->iNext + 1;
LAB_0071a0fa:
            iVar16 = *piVar22;
            if (iVar16 == 0) break;
            goto LAB_00719fa5;
          }
          uVar5 = pClause->nLits;
          uVar21 = 2;
          if (2 < (int)uVar5) {
            uVar21 = 2;
            do {
              uVar9 = piVar2[lVar19 + uVar21 + 3];
              if ((int)uVar9 < 0) goto LAB_0071a7ec;
              if (iVar16 <= (int)(uVar9 >> 1)) goto LAB_0071a80b;
              uVar3 = *(undefined8 *)(pGVar11 + (uVar9 >> 1));
              if ((((uint)uVar3 >> 0x1e & 1) == 0) ||
                 ((((uint)((ulong)uVar3 >> 0x3e) ^ uVar9) & 1) != 0)) {
                piVar2[lVar19 + 4] = uVar9;
                pClause[1].iNext[uVar21] = uVar6;
                *piVar22 = piVar2[lVar19 + 1];
                Tas_ManWatchClause(p,pClause,piVar2[lVar19 + 4]);
                goto LAB_0071a09e;
              }
              uVar21 = uVar21 + 1;
            } while (uVar5 != uVar21);
            uVar21 = (ulong)uVar5;
          }
LAB_0071a09e:
          if ((int)uVar21 < pClause->nLits) goto LAB_0071a0fa;
          uVar5 = pClause[1].iNext[0];
          if ((int)uVar5 < 0) goto LAB_0071a7ec;
          uVar9 = uVar5 >> 1;
          if (p->pAig->nObjs <= (int)uVar9) goto LAB_0071a80b;
          pGVar11 = p->pAig->pObjs;
          uVar3 = *(undefined8 *)(pGVar11 + uVar9);
          if (((uint)uVar3 >> 0x1e & 1) == 0) {
            Tas_ManAssign(p,(Gia_Obj_t *)((ulong)(uVar5 & 1) ^ (ulong)(pGVar11 + uVar9)),Level,
                          (Gia_Obj_t *)0x0,(Gia_Obj_t *)pClause);
            goto LAB_0071a0f3;
          }
          if ((((uint)((ulong)uVar3 >> 0x3e) ^ uVar5) & 1) != 0) {
            __assert_fail("!Tas_LitIsTrue( pObj, pCur->pLits[0] )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x463,"int Tas_ManPropagateWatch(Tas_Man_t *, int, int)");
          }
          iVar16 = (p->pClauses).iTail;
          if ((p->pClauses).iHead != iVar16) {
            __assert_fail("Tas_QueIsEmpty( pQue )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x402,"int Tas_ManCreateFromCls(Tas_Man_t *, Tas_Cls_t *, int)");
          }
          iVar7 = (p->pClauses).nSize;
          if (iVar16 == iVar7) {
            (p->pClauses).nSize = iVar7 * 2;
            ppGVar8 = (p->pClauses).pData;
            if (ppGVar8 == (Gia_Obj_t **)0x0) {
              ppGVar8 = (Gia_Obj_t **)malloc((long)iVar7 << 4);
            }
            else {
              ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,(long)iVar7 << 4);
            }
            (p->pClauses).pData = ppGVar8;
          }
          iVar16 = (p->pClauses).iTail;
          (p->pClauses).iTail = iVar16 + 1;
          (p->pClauses).pData[iVar16] = (Gia_Obj_t *)0x0;
          if (0 < pClause->nLits) {
            lVar23 = 0;
            do {
              uVar6 = piVar2[lVar19 + lVar23 + 3];
              if ((int)uVar6 < 0) {
LAB_0071a7ec:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              uVar5 = uVar6 >> 1;
              if (p->pAig->nObjs <= (int)uVar5) {
LAB_0071a80b:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              pGVar11 = p->pAig->pObjs;
              uVar3 = *(undefined8 *)(pGVar11 + uVar5);
              if (((uint)uVar3 >> 0x1e & 1) == 0) {
                __assert_fail("Tas_VarIsAssigned(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                              ,0x407,"int Tas_ManCreateFromCls(Tas_Man_t *, Tas_Cls_t *, int)");
              }
              if ((((uint)((ulong)uVar3 >> 0x3e) ^ uVar6) & 1) != 0) {
                __assert_fail("!Tas_LitIsTrue( pObj, pCls->pLits[i] )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                              ,0x408,"int Tas_ManCreateFromCls(Tas_Man_t *, Tas_Cls_t *, int)");
              }
              iVar16 = (p->pClauses).nSize;
              if ((p->pClauses).iTail == iVar16) {
                (p->pClauses).nSize = iVar16 * 2;
                ppGVar8 = (p->pClauses).pData;
                if (ppGVar8 == (Gia_Obj_t **)0x0) {
                  ppGVar8 = (Gia_Obj_t **)malloc((long)iVar16 << 4);
                }
                else {
                  ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,(long)iVar16 << 4);
                }
                (p->pClauses).pData = ppGVar8;
              }
              iVar16 = (p->pClauses).iTail;
              (p->pClauses).iTail = iVar16 + 1;
              (p->pClauses).pData[iVar16] = pGVar11 + uVar5;
              lVar23 = lVar23 + 1;
            } while (lVar23 < pClause->nLits);
          }
          Tas_ManDeriveReason(p,Level);
          iVar7 = (p->pClauses).iHead;
          iVar16 = (p->pClauses).iTail;
          if (iVar16 <= iVar7) {
            __assert_fail("p->iHead < p->iTail",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x1a5,"int Tas_QueFinish(Tas_Que_t *)");
          }
          iVar13 = (p->pClauses).nSize;
          if (iVar16 == iVar13) {
            (p->pClauses).nSize = iVar13 * 2;
            ppGVar8 = (p->pClauses).pData;
            if (ppGVar8 == (Gia_Obj_t **)0x0) {
              ppGVar8 = (Gia_Obj_t **)malloc((long)iVar13 << 4);
            }
            else {
              ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,(long)iVar13 << 4);
            }
            (p->pClauses).pData = ppGVar8;
          }
          iVar16 = (p->pClauses).iTail;
          iVar13 = iVar16 + 1;
          (p->pClauses).iTail = iVar13;
          (p->pClauses).pData[iVar16] = (Gia_Obj_t *)0x0;
          (p->pClauses).iHead = iVar13;
        }
        goto LAB_0071a2c9;
      }
    }
LAB_0071a5b7:
    (p->pProp).iHead = uVar6;
    iVar16 = (p->pJust).iHead;
    iVar7 = (p->pJust).iTail;
    if (iVar16 < iVar7) {
      lVar20 = (long)iVar16;
      ppGVar8 = (p->pJust).pData;
      pGVar1 = ppGVar8[lVar20];
      while (pGVar1 != (Gia_Obj_t *)0x0) {
        lVar20 = lVar20 + 1;
        uVar21 = *(ulong *)pGVar1;
        uVar6 = (uint)uVar21;
        uVar12 = uVar21 & 0x1fffffff;
        bVar4 = uVar12 == 0x1fffffff || (int)uVar6 < 0;
        uVar5 = (uint)(uVar21 >> 0x20);
        if (((bVar4) || ((pGVar1[-uVar12].field_0x3 & 0x40) != 0)) ||
           ((pGVar1[-(ulong)(uVar5 & 0x1fffffff)].field_0x3 & 0x40) != 0)) {
          s_Counter4 = s_Counter4 + 1;
          if (((ulong)pGVar1 & 1) != 0) {
            __assert_fail("!Gia_IsComplement(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x4be,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
          }
          if (bVar4) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x4bf,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
          }
          if (uVar6 < 0x40000000) {
            __assert_fail("Tas_VarIsAssigned(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x4c0,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
          }
          if ((uVar6 >> 0x1e & 1) == 0) {
LAB_0071a8a6:
            __assert_fail("pVar->fMark0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x78,"int Tas_VarValue(Gia_Obj_t *)");
          }
          if ((uVar21 & 0x4000000000000000) != 0) {
            __assert_fail("!Tas_VarValue(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x4c1,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
          }
          uVar14 = ((uint)(uVar21 >> 0x1d) & 7 ^
                   (uint)((ulong)*(undefined8 *)(pGVar1 + -uVar12) >> 0x3e)) & 1;
          uVar9 = (uint)*(undefined8 *)(pGVar1 + -uVar12);
          if ((uVar9 >> 0x1e & 1) == 0) {
            uVar14 = 2;
          }
          uVar15 = (uint)*(undefined8 *)(pGVar1 + -(ulong)(uVar5 & 0x1fffffff));
          uVar18 = (uVar5 >> 0x1d ^
                   (uint)((ulong)*(undefined8 *)(pGVar1 + -(ulong)(uVar5 & 0x1fffffff)) >> 0x3e)) &
                   1;
          if ((uVar15 >> 0x1e & 1) == 0) {
            uVar18 = 2;
          }
          iVar7 = 0;
          if ((uVar14 != 0) && (uVar18 != 0)) {
            if ((uVar14 == 1) && (uVar18 == 1)) {
              iVar7 = Tas_ManAnalyze(p,Level,pGVar1,pGVar1 + -uVar12,
                                     pGVar1 + -(ulong)(uVar5 & 0x1fffffff));
            }
            else {
              if ((uVar14 != 1) && (uVar18 != 1)) {
                __assert_fail("Value0 == 1 || Value1 == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                              ,0x4c9,"int Tas_ManPropagateTwo(Tas_Man_t *, Gia_Obj_t *, int)");
              }
              if ((uVar9 >> 0x1e & 1) == 0) {
                Tas_ManAssign(p,(Gia_Obj_t *)
                                (((ulong)(uVar6 >> 0x1d & 1) | (ulong)(pGVar1 + -uVar12)) ^ 1),Level
                              ,pGVar1,pGVar1 + -(ulong)(uVar5 & 0x1fffffff));
              }
              iVar7 = 0;
              if ((uVar15 >> 0x1e & 1) == 0) {
                uVar21 = *(ulong *)pGVar1;
                Tas_ManAssign(p,(Gia_Obj_t *)
                                (((ulong)((uint)(uVar21 >> 0x3d) & 1) |
                                 (ulong)(pGVar1 + -(uVar21 >> 0x20 & 0x1fffffff))) ^ 1),Level,pGVar1
                              ,pGVar1 + -(uVar21 & 0x1fffffff));
              }
            }
          }
          if (iVar7 != 0) {
            return iVar7;
          }
        }
        else {
          lVar19 = (long)iVar16;
          iVar16 = iVar16 + 1;
          ppGVar8[lVar19] = pGVar1;
        }
        iVar7 = (p->pJust).iTail;
        if (iVar7 <= lVar20) break;
        ppGVar8 = (p->pJust).pData;
        pGVar1 = ppGVar8[lVar20];
      }
    }
    if (iVar16 == iVar7) {
      return 0;
    }
    (p->pJust).iTail = iVar16;
  } while( true );
  iVar7 = 0;
LAB_0071a2c9:
  if (iVar7 != 0) goto LAB_0071a576;
  uVar21 = *(ulong *)pGVar1;
  uVar6 = (uint)uVar21;
  iVar7 = 0;
  if ((~uVar6 & 0x9fffffff) == 0) goto LAB_0071a576;
  if (((int)uVar6 < 0) || (uVar5 = uVar6 & 0x1fffffff, uVar5 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x488,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
  }
  uVar12 = *(ulong *)(pGVar1 + -(ulong)uVar5);
  uVar14 = ((uint)(uVar21 >> 0x1d) & 7 ^ (uint)(uVar12 >> 0x3e)) & 1;
  uVar9 = (uint)uVar12;
  if ((uVar12 & 0x40000000) == 0) {
    uVar14 = 2;
  }
  uVar18 = (uint)(uVar21 >> 0x20);
  uVar12 = (ulong)(uVar18 & 0x1fffffff);
  uVar15 = (uint)*(undefined8 *)(pGVar1 + -uVar12);
  uVar18 = (uVar18 >> 0x1d ^ (uint)((ulong)*(undefined8 *)(pGVar1 + -uVar12) >> 0x3e)) & 1;
  if ((uVar15 >> 0x1e & 1) == 0) {
    uVar18 = 2;
  }
  if ((uVar6 >> 0x1e & 1) == 0) goto LAB_0071a8a6;
  pGVar11 = pGVar1 + -(ulong)uVar5;
  pGVar17 = pGVar1 + -uVar12;
  if ((uVar21 & 0x4000000000000000) == 0) {
    if (uVar18 == 0 || uVar14 == 0) goto LAB_0071a576;
    if ((uVar14 == 1) && (uVar18 == 1)) goto LAB_0071a569;
    if ((uVar14 != 1) && (uVar18 != 1)) {
      if (((uVar9 | uVar15) >> 0x1e & 1) != 0) {
        __assert_fail("Tas_VarIsJust(pVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                      ,0x4a9,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
      }
      iVar16 = (p->pJust).iHead;
      lVar19 = (long)iVar16;
      iVar13 = (p->pJust).iTail;
      if (iVar16 < iVar13) {
        do {
          pGVar11 = (p->pJust).pData[lVar19];
          if (pGVar11 == (Gia_Obj_t *)0x0) break;
          if (pGVar11 == pGVar1) {
            __assert_fail("!Tas_QueHasNode( &p->pJust, pVar )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                          ,0x4aa,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
          }
          lVar19 = lVar19 + 1;
        } while (iVar13 != lVar19);
      }
      iVar16 = (p->pJust).nSize;
      if ((p->pJust).iTail == iVar16) {
        (p->pJust).nSize = iVar16 * 2;
        ppGVar8 = (p->pJust).pData;
        if (ppGVar8 == (Gia_Obj_t **)0x0) {
          ppGVar8 = (Gia_Obj_t **)malloc((long)iVar16 << 4);
        }
        else {
          ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,(long)iVar16 << 4);
        }
        (p->pJust).pData = ppGVar8;
      }
      iVar16 = (p->pJust).iTail;
      (p->pJust).iTail = iVar16 + 1;
      (p->pJust).pData[iVar16] = pGVar1;
      goto LAB_0071a576;
    }
    if ((uVar9 >> 0x1e & 1) == 0) {
      Tas_ManAssign(p,(Gia_Obj_t *)(((ulong)(uVar6 >> 0x1d & 1) | (ulong)pGVar11) ^ 1),Level,pGVar1,
                    pGVar17);
    }
    iVar7 = 0;
    if ((uVar15 >> 0x1e & 1) != 0) goto LAB_0071a576;
    uVar21 = *(ulong *)pGVar1;
    pGVar17 = (Gia_Obj_t *)
              (((ulong)((uint)(uVar21 >> 0x3d) & 1) |
               (ulong)(pGVar1 + -(uVar21 >> 0x20 & 0x1fffffff))) ^ 1);
    pGVar11 = pGVar1 + -(uVar21 & 0x1fffffff);
  }
  else {
    if (uVar18 == 0 || uVar14 == 0) {
      if (((uVar14 == 0) && (pGVar10 = pGVar11, uVar18 != 0)) ||
         ((uVar14 != 0 && (pGVar10 = pGVar17, uVar18 == 0)))) {
        pGVar17 = (Gia_Obj_t *)0x0;
        pGVar11 = pGVar10;
      }
      else if (uVar14 != 0 || uVar18 != 0) {
        __assert_fail("Value0 == 0 && Value1 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                      ,0x493,"int Tas_ManPropagateOne(Tas_Man_t *, Gia_Obj_t *, int)");
      }
LAB_0071a569:
      iVar7 = Tas_ManAnalyze(p,Level,pGVar1,pGVar11,pGVar17);
      goto LAB_0071a576;
    }
    if ((uVar9 >> 0x1e & 1) == 0) {
      Tas_ManAssign(p,(Gia_Obj_t *)((ulong)(uVar6 >> 0x1d & 1) | (ulong)pGVar11),Level,pGVar1,
                    (Gia_Obj_t *)0x0);
    }
    iVar7 = 0;
    if ((uVar15 >> 0x1e & 1) != 0) goto LAB_0071a576;
    uVar6 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20);
    pGVar17 = (Gia_Obj_t *)
              ((ulong)(uVar6 >> 0x1d & 1) | (ulong)(pGVar1 + -(ulong)(uVar6 & 0x1fffffff)));
    pGVar11 = (Gia_Obj_t *)0x0;
  }
  Tas_ManAssign(p,pGVar17,Level,pGVar1,pGVar11);
  iVar7 = 0;
LAB_0071a576:
  if (iVar7 != 0) {
    return iVar7;
  }
  lVar20 = lVar20 + 1;
  uVar6 = (p->pProp).iTail;
  uVar21 = (ulong)(int)uVar6;
  if ((long)uVar21 <= lVar20) goto LAB_0071a5b7;
  goto LAB_00719f07;
}

Assistant:

int Tas_ManPropagate( Tas_Man_t * p, int Level )
{
    int hClause;
    Gia_Obj_t * pVar;
    int i, k;//, nIter = 0;
    while ( 1 )
    {
//        nIter++;
        Tas_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( (hClause = Tas_ManPropagateOne( p, pVar, Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Tas_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Tas_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( (hClause = Tas_ManPropagateTwo( p, pVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
//    printf( "%d ", nIter );
    return 0;
}